

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Cast_x86_avx512::forward(Cast_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _elempack;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte bVar9;
  byte bVar10;
  unsigned_short uVar11;
  int iVar12;
  int iVar13;
  _func_int **pp_Var14;
  uint uVar15;
  uint uVar16;
  _func_int *p_Var17;
  void *pvVar18;
  int iVar19;
  size_t sVar20;
  undefined1 (*pauVar21) [64];
  undefined1 (*pauVar22) [32];
  void *pvVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [64];
  int iVar26;
  ulong uVar27;
  uint uVar28;
  undefined1 (*pauVar29) [16];
  uint uVar30;
  long lVar31;
  long lVar32;
  ushort uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar36 [32];
  
  p_Var17 = this->_vptr_Cast_x86_avx512[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var17) == *(int *)(&this->field_0xd4 + (long)p_Var17)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar13 = bottom_blob->w;
    iVar26 = bottom_blob->h;
    iVar1 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar13;
    top_blob->h = iVar26;
    top_blob->d = iVar1;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar13 = bottom_blob->w;
  iVar26 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  uVar16 = bottom_blob->c;
  iVar19 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar20 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var17)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var17) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx512 + (long)p_Var17),bottom_blob,
                    top_blob,opt);
    }
    sVar20 = sVar20 * 4;
    break;
  case 2:
  case 4:
    sVar20 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar20 = bottom_blob->elemsize;
  }
  switch(iVar19) {
  case 1:
    Mat::create(top_blob,iVar13,sVar20,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar13,iVar26,sVar20,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar13,iVar26,uVar16,sVar20,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar13,iVar26,iVar1,uVar16,sVar20,_elempack,opt->blob_allocator);
  }
  auVar34 = in_ZMM6._0_16_;
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  pp_Var14 = this->_vptr_Cast_x86_avx512;
  p_Var17 = pp_Var14[-3];
  iVar19 = *(int *)(&this->field_0xd0 + (long)p_Var17);
  if (iVar19 == 1) {
    if ((*(int *)(&this->field_0xd4 + (long)p_Var17) == 2) &&
       (iVar19 = bottom_blob->c, 0 < (long)iVar19)) {
      uVar30 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      lVar32 = 0;
      do {
        pauVar21 = (undefined1 (*) [64])
                   (bottom_blob->cstep * lVar32 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar29 = (undefined1 (*) [16])
                   (top_blob->cstep * lVar32 * top_blob->elemsize + (long)top_blob->data);
        if ((int)uVar30 < 0x10) {
          uVar28 = 0;
        }
        else {
          iVar12 = 0xf;
          do {
            auVar38 = vmovdqu64_avx512f(*pauVar21);
            auVar34 = vcvtps2ph_avx512vl(auVar38._0_16_,0);
            *(long *)*pauVar29 = auVar34._0_8_;
            *(undefined8 *)(*pauVar29 + 8) = 0;
            *(undefined8 *)pauVar29[1] = 0;
            *(undefined8 *)(pauVar29[1] + 8) = 0;
            pauVar21 = pauVar21 + 1;
            pauVar29 = pauVar29 + 2;
            iVar12 = iVar12 + 0x10;
            uVar28 = uVar30 & 0xfffffff0;
          } while (iVar12 < (int)uVar30);
        }
        uVar15 = uVar28 | 7;
        while ((int)uVar15 < (int)uVar30) {
          auVar34 = vcvtps2ph_f16c(*(undefined1 (*) [32])*pauVar21,8);
          *pauVar29 = auVar34;
          pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x20);
          pauVar29 = pauVar29 + 1;
          uVar15 = uVar28 + 0xf;
          uVar28 = uVar28 + 8;
        }
        uVar15 = uVar28 | 3;
        while ((int)uVar15 < (int)uVar30) {
          vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar21,8);
          pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x10);
          pauVar29 = (undefined1 (*) [16])(*pauVar29 + 8);
          uVar15 = uVar28 + 7;
          uVar28 = uVar28 + 4;
        }
        if (uVar30 - uVar28 != 0 && (int)uVar28 <= (int)uVar30) {
          lVar31 = 0;
          do {
            in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
            uVar11 = float32_to_float16(*(float *)(*pauVar21 + lVar31 * 4));
            *(unsigned_short *)(*pauVar29 + lVar31 * 2) = uVar11;
            lVar31 = lVar31 + 1;
          } while (uVar30 - uVar28 != (int)lVar31);
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 != iVar19);
      pp_Var14 = this->_vptr_Cast_x86_avx512;
      p_Var17 = pp_Var14[-3];
      iVar19 = *(int *)(&this->field_0xd0 + (long)p_Var17);
      goto LAB_004a71a3;
    }
  }
  else {
LAB_004a71a3:
    auVar34 = in_ZMM6._0_16_;
    if (iVar19 == 2) {
      if ((*(int *)(&this->field_0xd4 + (long)p_Var17) != 1) ||
         (iVar19 = bottom_blob->c, (long)iVar19 < 1)) goto LAB_004a75be;
      uVar30 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      lVar32 = 0;
      do {
        pauVar22 = (undefined1 (*) [32])
                   (bottom_blob->cstep * lVar32 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar21 = (undefined1 (*) [64])
                   (top_blob->cstep * lVar32 * top_blob->elemsize + (long)top_blob->data);
        if ((int)uVar30 < 0x10) {
          uVar28 = 0;
        }
        else {
          iVar12 = 0xf;
          do {
            auVar38 = vcvtph2ps_avx512f(*pauVar22);
            auVar38 = vmovdqu64_avx512f(auVar38);
            *pauVar21 = auVar38;
            pauVar22 = pauVar22 + 1;
            pauVar21 = pauVar21 + 1;
            iVar12 = iVar12 + 0x10;
            uVar28 = uVar30 & 0xfffffff0;
          } while (iVar12 < (int)uVar30);
        }
        uVar15 = uVar28 | 7;
        while ((int)uVar15 < (int)uVar30) {
          auVar36 = vcvtph2ps_f16c(*(undefined1 (*) [16])*pauVar22);
          *(undefined1 (*) [32])*pauVar21 = auVar36;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x20);
          uVar15 = uVar28 + 0xf;
          uVar28 = uVar28 + 8;
        }
        uVar15 = uVar28 | 3;
        while ((int)uVar15 < (int)uVar30) {
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)*pauVar22;
          auVar34 = vcvtph2ps_f16c(auVar34);
          *(undefined1 (*) [16])*pauVar21 = auVar34;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 8);
          pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x10);
          uVar15 = uVar28 + 7;
          uVar28 = uVar28 + 4;
        }
        if (uVar30 - uVar28 != 0 && (int)uVar28 <= (int)uVar30) {
          lVar31 = 0;
          do {
            in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
            fVar44 = float16_to_float32(*(unsigned_short *)(*pauVar22 + lVar31 * 2));
            *(float *)(*pauVar21 + lVar31 * 4) = fVar44;
            lVar31 = lVar31 + 1;
          } while (uVar30 - uVar28 != (int)lVar31);
        }
        auVar34 = in_ZMM6._0_16_;
        lVar32 = lVar32 + 1;
      } while (lVar32 != iVar19);
      pp_Var14 = this->_vptr_Cast_x86_avx512;
      p_Var17 = pp_Var14[-3];
      iVar19 = *(int *)(&this->field_0xd0 + (long)p_Var17);
    }
    if (iVar19 == 3) {
      if ((int)uVar16 < 1 || *(int *)(&this->field_0xd4 + (long)p_Var17) != 1) goto LAB_004a75be;
      uVar30 = iVar1 * _elempack * iVar26 * iVar13;
      pvVar18 = bottom_blob->data;
      sVar20 = bottom_blob->cstep;
      pvVar23 = top_blob->data;
      sVar3 = top_blob->cstep;
      sVar4 = top_blob->elemsize;
      sVar5 = bottom_blob->elemsize;
      uVar24 = 0;
      do {
        if (0 < (int)uVar30) {
          uVar27 = 0;
          do {
            *(float *)((long)pvVar23 + uVar27 * 4) = (float)(int)*(char *)((long)pvVar18 + uVar27);
            uVar27 = uVar27 + 1;
          } while (uVar30 != uVar27);
        }
        uVar24 = uVar24 + 1;
        pvVar23 = (void *)((long)pvVar23 + sVar3 * sVar4);
        pvVar18 = (void *)((long)pvVar18 + sVar20 * sVar5);
      } while (uVar24 != uVar16);
      p_Var17 = pp_Var14[-3];
      iVar19 = *(int *)(&this->field_0xd0 + (long)p_Var17);
    }
    if (iVar19 != 1) goto LAB_004a75be;
  }
  if (*(int *)(&this->field_0xd4 + (long)p_Var17) == 4) {
    iVar13 = cpu_support_x86_avx512_bf16();
    if (iVar13 == 0) {
      iVar13 = bottom_blob->c;
      if (0 < (long)iVar13) {
        uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar32 = 0;
        auVar38 = vpmovsxbw_avx512bw(_DAT_00570ab9);
        auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          pauVar21 = (undefined1 (*) [64])
                     (bottom_blob->cstep * lVar32 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar25 = (undefined1 (*) [64])
                     (top_blob->cstep * lVar32 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar16 < 0x20) {
            uVar30 = 0;
          }
          else {
            iVar26 = 0x1f;
            do {
              auVar42 = vmovdqu64_avx512f(*pauVar21);
              auVar42 = vpermt2w_avx512bw(auVar42,auVar38,pauVar21[1]);
              auVar42 = vmovdqu64_avx512f(auVar42);
              *pauVar25 = auVar42;
              pauVar21 = pauVar21 + 2;
              pauVar25 = pauVar25 + 1;
              iVar26 = iVar26 + 0x20;
              uVar30 = uVar16 & 0xffffffe0;
            } while (iVar26 < (int)uVar16);
          }
          uVar28 = uVar30 | 0xf;
          while ((int)uVar28 < (int)uVar16) {
            auVar42 = vpsrld_avx512f(*pauVar21,0x10);
            auVar36 = vpmovdw_avx512f(auVar42);
            *(undefined1 (*) [32])*pauVar25 = auVar36;
            pauVar21 = pauVar21 + 1;
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
            uVar28 = uVar30 + 0x1f;
            uVar30 = uVar30 + 0x10;
          }
          uVar28 = uVar30 | 7;
          while ((int)uVar28 < (int)uVar16) {
            auVar36 = vpsrld_avx512vl(*(undefined1 (*) [32])*pauVar21,0x10);
            auVar45 = vpackusdw_avx(auVar36._0_16_,auVar36._16_16_);
            *(undefined1 (*) [16])*pauVar25 = auVar45;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x20);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
            uVar28 = uVar30 + 0xf;
            uVar30 = uVar30 + 8;
          }
          if ((int)uVar30 < (int)uVar16) {
            auVar42 = vpbroadcastq_avx512f();
            uVar24 = 0;
            do {
              auVar43 = vpbroadcastq_avx512f();
              auVar39 = vporq_avx512f(auVar43,auVar40);
              auVar43 = vporq_avx512f(auVar43,auVar41);
              uVar7 = vpcmpuq_avx512f(auVar43,auVar42,2);
              bVar9 = (byte)uVar7;
              uVar7 = vpcmpuq_avx512f(auVar39,auVar42,2);
              bVar10 = (byte)uVar7;
              uVar33 = CONCAT11(bVar10,bVar9);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(*pauVar21 + uVar24 * 4));
              auVar39._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar43._4_4_;
              auVar39._0_4_ = (uint)(bVar9 & 1) * auVar43._0_4_;
              auVar39._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar43._8_4_;
              auVar39._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar43._12_4_;
              auVar39._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar43._16_4_;
              auVar39._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar43._20_4_;
              auVar39._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar43._24_4_;
              auVar39._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar43._28_4_;
              auVar39._32_4_ = (uint)(bVar10 & 1) * auVar43._32_4_;
              auVar39._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar43._36_4_;
              auVar39._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar43._40_4_;
              auVar39._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar43._44_4_;
              auVar39._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar43._48_4_;
              auVar39._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar43._52_4_;
              auVar39._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar43._56_4_;
              auVar39._60_4_ = (uint)(bVar10 >> 7) * auVar43._60_4_;
              auVar43 = vpsrld_avx512f(auVar39,0x10);
              pauVar22 = (undefined1 (*) [32])(*pauVar25 + uVar24 * 2);
              auVar36 = vpmovdw_avx512f(auVar43);
              auVar35._0_2_ =
                   (ushort)(bVar9 & 1) * auVar36._0_2_ |
                   (ushort)!(bool)(bVar9 & 1) * *(short *)*pauVar22;
              bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
              auVar35._2_2_ =
                   (ushort)bVar6 * auVar36._2_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 2);
              bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
              auVar35._4_2_ =
                   (ushort)bVar6 * auVar36._4_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 4);
              bVar6 = (bool)((byte)(uVar33 >> 3) & 1);
              auVar35._6_2_ =
                   (ushort)bVar6 * auVar36._6_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 6);
              bVar6 = (bool)((byte)(uVar33 >> 4) & 1);
              auVar35._8_2_ =
                   (ushort)bVar6 * auVar36._8_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 8);
              bVar6 = (bool)((byte)(uVar33 >> 5) & 1);
              auVar35._10_2_ =
                   (ushort)bVar6 * auVar36._10_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 10);
              bVar6 = (bool)((byte)(uVar33 >> 6) & 1);
              auVar35._12_2_ =
                   (ushort)bVar6 * auVar36._12_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 0xc);
              bVar6 = (bool)((byte)(uVar33 >> 7) & 1);
              auVar35._14_2_ =
                   (ushort)bVar6 * auVar36._14_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 0xe);
              auVar35._16_2_ =
                   (ushort)(bVar10 & 1) * auVar36._16_2_ |
                   (ushort)!(bool)(bVar10 & 1) * *(short *)(*pauVar22 + 0x10);
              bVar6 = (bool)(bVar10 >> 1 & 1);
              auVar35._18_2_ =
                   (ushort)bVar6 * auVar36._18_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 0x12);
              bVar6 = (bool)(bVar10 >> 2 & 1);
              auVar35._20_2_ =
                   (ushort)bVar6 * auVar36._20_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 0x14);
              bVar6 = (bool)(bVar10 >> 3 & 1);
              auVar35._22_2_ =
                   (ushort)bVar6 * auVar36._22_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 0x16);
              bVar6 = (bool)(bVar10 >> 4 & 1);
              auVar35._24_2_ =
                   (ushort)bVar6 * auVar36._24_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 0x18);
              bVar6 = (bool)(bVar10 >> 5 & 1);
              auVar35._26_2_ =
                   (ushort)bVar6 * auVar36._26_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 0x1a);
              bVar6 = (bool)(bVar10 >> 6 & 1);
              auVar35._28_2_ =
                   (ushort)bVar6 * auVar36._28_2_ | (ushort)!bVar6 * *(short *)(*pauVar22 + 0x1c);
              auVar35._30_2_ =
                   (ushort)(bVar10 >> 7) * auVar36._30_2_ |
                   (ushort)!(bool)(bVar10 >> 7) * *(short *)(*pauVar22 + 0x1e);
              *pauVar22 = auVar35;
              uVar24 = uVar24 + 0x10;
            } while (((ulong)(~uVar30 + uVar16) + 0x10 & 0x1fffffff0) != uVar24);
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 != iVar13);
      }
    }
    else {
      cast_fp32_to_bf16_sse_avx512bf16(bottom_blob,top_blob,opt);
    }
  }
LAB_004a75be:
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 4) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1)) {
    auVar38 = ZEXT1664(auVar34);
    iVar13 = cpu_support_x86_avx512_bf16();
    if (iVar13 == 0) {
      iVar13 = bottom_blob->c;
      if (0 < (long)iVar13) {
        uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar32 = 0;
        auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          pauVar22 = (undefined1 (*) [32])
                     (bottom_blob->cstep * lVar32 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar21 = (undefined1 (*) [64])
                     (top_blob->cstep * lVar32 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar16 < 0x10) {
            uVar30 = 0;
          }
          else {
            iVar26 = 0xf;
            auVar42 = auVar38;
            do {
              auVar35 = vpunpcklwd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*pauVar22);
              auVar36 = vpunpckhwd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*pauVar22);
              auVar38._0_16_ = ZEXT116(0) * auVar36._0_16_ + ZEXT116(1) * auVar35._0_16_;
              auVar38._32_32_ = auVar42._32_32_;
              auVar38._16_16_ = ZEXT116(0) * auVar35._16_16_ + ZEXT116(1) * auVar36._0_16_;
              auVar36 = vperm2i128_avx2(auVar35,auVar36,0x31);
              auVar42 = vinserti64x4_avx512f(auVar38,auVar36,1);
              auVar42 = vmovdqu64_avx512f(auVar42);
              *pauVar21 = auVar42;
              pauVar22 = pauVar22 + 1;
              pauVar21 = pauVar21 + 1;
              iVar26 = iVar26 + 0x10;
              auVar42 = auVar38;
              uVar30 = uVar16 & 0xfffffff0;
            } while (iVar26 < (int)uVar16);
          }
          uVar28 = uVar30 | 7;
          while ((int)uVar28 < (int)uVar16) {
            auVar45 = vpunpcklwd_avx((undefined1  [16])0x0,*(undefined1 (*) [16])*pauVar22);
            auVar34 = vpunpckhwd_avx((undefined1  [16])0x0,*(undefined1 (*) [16])*pauVar22);
            *(undefined1 (*) [16])(*pauVar21 + 0x10) = auVar34;
            *(undefined1 (*) [16])*pauVar21 = auVar45;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x20);
            uVar28 = uVar30 + 0xf;
            uVar30 = uVar30 + 8;
          }
          uVar28 = uVar30 | 3;
          while ((int)uVar28 < (int)uVar16) {
            auVar45._8_8_ = 0;
            auVar45._0_8_ = *(ulong *)*pauVar22;
            auVar34 = vpunpcklwd_avx((undefined1  [16])0x0,auVar45);
            *(undefined1 (*) [16])*pauVar21 = auVar34;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + 8);
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x10);
            uVar28 = uVar30 + 7;
            uVar30 = uVar30 + 4;
          }
          if ((int)uVar30 < (int)uVar16) {
            auVar42 = vpbroadcastq_avx512f();
            uVar24 = 0;
            do {
              auVar43 = vpbroadcastq_avx512f();
              auVar38 = vporq_avx512f(auVar43,auVar40);
              auVar43 = vporq_avx512f(auVar43,auVar41);
              uVar7 = vpcmpuq_avx512f(auVar43,auVar42,2);
              uVar8 = vpcmpuq_avx512f(auVar38,auVar42,2);
              bVar9 = (byte)uVar8;
              uVar33 = CONCAT11(bVar9,(byte)uVar7);
              auVar36 = vmovdqu16_avx512vl(*(undefined1 (*) [32])(*pauVar22 + uVar24 * 2));
              auVar37._2_2_ = (ushort)((byte)(uVar33 >> 1) & 1) * auVar36._2_2_;
              auVar37._0_2_ = (ushort)((byte)uVar7 & 1) * auVar36._0_2_;
              auVar37._4_2_ = (ushort)((byte)(uVar33 >> 2) & 1) * auVar36._4_2_;
              auVar37._6_2_ = (ushort)((byte)(uVar33 >> 3) & 1) * auVar36._6_2_;
              auVar37._8_2_ = (ushort)((byte)(uVar33 >> 4) & 1) * auVar36._8_2_;
              auVar37._10_2_ = (ushort)((byte)(uVar33 >> 5) & 1) * auVar36._10_2_;
              auVar37._12_2_ = (ushort)((byte)(uVar33 >> 6) & 1) * auVar36._12_2_;
              auVar37._14_2_ = (ushort)((byte)(uVar33 >> 7) & 1) * auVar36._14_2_;
              auVar37._16_2_ = (ushort)(bVar9 & 1) * auVar36._16_2_;
              auVar37._18_2_ = (ushort)(bVar9 >> 1 & 1) * auVar36._18_2_;
              auVar37._20_2_ = (ushort)(bVar9 >> 2 & 1) * auVar36._20_2_;
              auVar37._22_2_ = (ushort)(bVar9 >> 3 & 1) * auVar36._22_2_;
              auVar37._24_2_ = (ushort)(bVar9 >> 4 & 1) * auVar36._24_2_;
              auVar37._26_2_ = (ushort)(bVar9 >> 5 & 1) * auVar36._26_2_;
              auVar37._28_2_ = (ushort)(bVar9 >> 6 & 1) * auVar36._28_2_;
              auVar37._30_2_ = (ushort)(bVar9 >> 7) * auVar36._30_2_;
              auVar43 = vpmovzxwd_avx512f(auVar37);
              auVar43 = vpslld_avx512f(auVar43,0x10);
              auVar43 = vmovdqu32_avx512f(auVar43);
              *(undefined1 (*) [64])(*pauVar21 + uVar24 * 4) = auVar43;
              uVar24 = uVar24 + 0x10;
            } while (((ulong)(~uVar30 + uVar16) + 0x10 & 0x1fffffff0) != uVar24);
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 != iVar13);
      }
    }
    else {
      cast_bf16_to_fp32_sse_avx512bf16(bottom_blob,top_blob,opt);
    }
  }
  return 0;
}

Assistant:

int Cast_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}